

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O0

QRect QHighDpi::toNativeWindowGeometry<QRect,QWindow>(QRect *value,QWindow *context)

{
  long lVar1;
  Point PVar2;
  QPoint origin;
  ulong uVar3;
  QRect *in_RSI;
  long in_FS_OFFSET;
  QRect QVar4;
  QPoint effectiveOrigin;
  ScaleAndOrigin so;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QPoint *in_stack_ffffffffffffff80;
  QRect *rect;
  Representation in_stack_ffffffffffffffd8;
  Representation RVar5;
  undefined4 uStack_20;
  Representation local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RVar5.m_i = 0;
  rect = in_RSI;
  QPoint::QPoint(in_stack_ffffffffffffff80);
  PVar2.point.xp.m_i = uStack_20;
  PVar2.kind = RVar5.m_i;
  PVar2.point.yp.m_i = local_1c.m_i;
  QHighDpiScaling::scaleAndOrigin((QWindow *)in_RSI,PVar2);
  if ((rect == (QRect *)0x0) || (uVar3 = QWindow::isTopLevel(), (uVar3 & 1) == 0)) {
    QPoint::QPoint(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  }
  origin.yp.m_i = RVar5.m_i;
  origin.xp.m_i = in_stack_ffffffffffffffd8.m_i;
  QVar4 = scale(rect,(qreal)in_RSI,origin);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar4;
}

Assistant:

T toNativeWindowGeometry(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    QPoint effectiveOrigin = (context && context->isTopLevel()) ? so.origin : QPoint(0,0);
    return scale(value, so.factor, effectiveOrigin);
}